

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O0

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *optdecl;
  int optchar;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  optarg = (char *)0x0;
  opterr = 0;
  optopt = 0;
  if ((((optind < ___argc) && (___argv[optind] != (char *)0x0)) && (*___argv[optind] == '-')) &&
     (iVar1 = strcmp(___argv[optind],"-"), iVar1 != 0)) {
    iVar1 = strcmp(___argv[optind],"--");
    if (iVar1 != 0) {
      if ((optcursor == (char *)0x0) || (*optcursor == '\0')) {
        optcursor = ___argv[optind] + 1;
      }
      optdecl._4_4_ = (int)*optcursor;
      optopt = optdecl._4_4_;
      pcVar2 = strchr(__shortopts,optdecl._4_4_);
      if (pcVar2 == (char *)0x0) {
        optdecl._4_4_ = 0x3f;
      }
      else if (pcVar2[1] == ':') {
        optarg = optcursor + 1;
        if (*optarg == '\0') {
          if (pcVar2[2] == ':') {
            optarg = (char *)0x0;
          }
          else {
            optind = optind + 1;
            if (optind < ___argc) {
              optarg = ___argv[optind];
            }
            else {
              optarg = (char *)0x0;
              optdecl._4_4_ = 0x3f;
              if (*__shortopts == ':') {
                optdecl._4_4_ = 0x3a;
              }
            }
          }
        }
        optcursor = (char *)0x0;
      }
      if ((optcursor == (char *)0x0) ||
         (pcVar3 = optcursor + 1, pcVar2 = optcursor + 1, optcursor = pcVar3, *pcVar2 == '\0')) {
        optind = optind + 1;
      }
      return optdecl._4_4_;
    }
    optind = optind + 1;
  }
  optcursor = (char *)0x0;
  return -1;
}

Assistant:

int getopt(int argc, char* const argv[], const char* optstring) {
  int optchar = -1;
  const char* optdecl = NULL;

  optarg = NULL;
  opterr = 0;
  optopt = 0;

  /* Unspecified, but we need it to avoid overrunning the argv bounds. */
  if (optind >= argc)
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] is a null pointer, getopt()
     shall return -1 without changing optind. */
  if (argv[optind] == NULL)
    goto no_more_optchars;

  /* If, when getopt() is called *argv[optind]  is not the character '-',
     getopt() shall return -1 without changing optind. */
  if (*argv[optind] != '-')
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] points to the string "-",
     getopt() shall return -1 without changing optind. */
  if (strcmp(argv[optind], "-") == 0)
    goto no_more_optchars;

  /* If, when getopt() is called argv[optind] points to the string "--",
     getopt() shall return -1 after incrementing optind. */
  if (strcmp(argv[optind], "--") == 0) {
    ++optind;
    goto no_more_optchars;
  }

  if (optcursor == NULL || *optcursor == '\0')
    optcursor = argv[optind] + 1;

  optchar = *optcursor;

  /* FreeBSD: The variable optopt saves the last known option character
     returned by getopt(). */
  optopt = optchar;

  /* The getopt() function shall return the next option character (if one is
     found) from argv that matches a character in optstring, if there is
     one that matches. */
  optdecl = strchr(optstring, optchar);
  if (optdecl) {
    /* [I]f a character is followed by a colon, the option takes an
       argument. */
    if (optdecl[1] == ':') {
      optarg = ++optcursor;
      if (*optarg == '\0') {
        /* GNU extension: Two colons mean an option takes an
           optional arg; if there is text in the current argv-element
           (i.e., in the same word as the option name itself, for example,
           "-oarg"), then it is returned in optarg, otherwise optarg is set
           to zero. */
        if (optdecl[2] != ':') {
          /* If the option was the last character in the string pointed to by
             an element of argv, then optarg shall contain the next element
             of argv, and optind shall be incremented by 2. If the resulting
             value of optind is greater than argc, this indicates a missing
             option-argument, and getopt() shall return an error indication.

             Otherwise, optarg shall point to the string following the
             option character in that element of argv, and optind shall be
             incremented by 1.
          */
          if (++optind < argc) {
            optarg = argv[optind];
          } else {
            /* If it detects a missing option-argument, it shall return the
               colon character ( ':' ) if the first character of optstring
               was a colon, or a question-mark character ( '?' ) otherwise.
            */
            optarg = NULL;
            optchar = (optstring[0] == ':') ? ':' : '?';
          }
        } else {
          optarg = NULL;
        }
      }

      optcursor = NULL;
    }
  } else {
    /* If getopt() encounters an option character that is not contained in
       optstring, it shall return the question-mark ( '?' ) character. */
    optchar = '?';
  }

  if (optcursor == NULL || *++optcursor == '\0')
    ++optind;

  return optchar;

no_more_optchars:
  optcursor = NULL;
  return -1;
}